

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

void xmlTextReaderErrMemory(xmlTextReaderPtr reader)

{
  if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,1,
                        (xmlError *)0x0);
  }
  else {
    xmlCtxtErrMemory(reader->ctxt);
  }
  reader->mode = 2;
  reader->state = XML_TEXTREADER_ERROR;
  return;
}

Assistant:

static void
xmlTextReaderErrMemory(xmlTextReaderPtr reader) {
    if (reader->ctxt != NULL)
        xmlCtxtErrMemory(reader->ctxt);
    else
        xmlRaiseMemoryError(NULL, NULL, NULL, XML_FROM_PARSER, NULL);
    reader->mode = XML_TEXTREADER_MODE_ERROR;
    reader->state = XML_TEXTREADER_ERROR;
}